

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

bool __thiscall
libcellml::Validator::ValidatorImpl::checkIssuesForDuplications
          (ValidatorImpl *this,string *description)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  Logger local_60;
  string local_50;
  
  sVar2 = Logger::issueCount(&this->mValidator->super_Logger);
  bVar5 = sVar2 != 0;
  if (bVar5) {
    uVar4 = 1;
    sVar3 = sVar2;
    do {
      sVar3 = sVar3 - 1;
      Logger::issue(&local_60,(size_t)this->mValidator);
      Issue::description_abi_cxx11_(&local_50,(Issue *)local_60._vptr_Logger);
      if (local_50._M_string_length == description->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_50._M_dataplus._M_p,(description->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_60.mPimpl != (LoggerImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.mPimpl);
      }
      if (bVar6) {
        return bVar5;
      }
      bVar5 = uVar4 < sVar2;
      uVar4 = uVar4 + 1;
    } while (sVar3 != 0);
  }
  return bVar5;
}

Assistant:

bool Validator::ValidatorImpl::checkIssuesForDuplications(const std::string &description) const
{
    size_t count = mValidator->issueCount();
    for (size_t i = 0; i < count; ++i) {
        if (mValidator->issue(count - 1 - i)->description() == description) {
            return true;
        }
    }
    return false;
}